

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biattentional.cc
# Opt level: O0

int main(int argc,char **argv)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  __pid_t _Var1;
  char *pcVar2;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar3;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar4;
  typed_value<int,_char> *ptVar5;
  size_type sVar6;
  undefined8 uVar7;
  ostream *poVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  uint *puVar10;
  size_type sVar11;
  reference pvVar12;
  vector<int,_std::allocator<int>_> *source;
  Expression *alignment;
  ulong uVar13;
  reference pvVar14;
  unsigned_long *puVar15;
  Tensor *pTVar16;
  string *psVar17;
  void *pvVar18;
  reference pvVar19;
  bool bVar20;
  float fVar21;
  double dVar22;
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined8 extraout_XMM1_Qa_03;
  undefined8 extraout_XMM1_Qa_04;
  undefined8 extraout_XMM1_Qa_05;
  undefined8 extraout_XMM1_Qa_06;
  undefined8 extraout_XMM1_Qa_07;
  undefined8 extraout_XMM1_Qa_08;
  undefined8 extraout_XMM1_Qa_09;
  undefined8 extraout_XMM1_Qa_10;
  undefined8 extraout_XMM1_Qa_11;
  undefined8 extraout_XMM1_Qa_12;
  undefined8 extraout_XMM1_Qa_13;
  undefined8 extraout_XMM1_Qa_14;
  undefined8 extraout_XMM1_Qa_15;
  undefined8 extraout_XMM1_Qa_16;
  undefined8 extraout_XMM1_Qa_17;
  undefined1 auVar24 [16];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 extraout_var_17 [56];
  undefined1 extraout_var_18 [56];
  undefined1 extraout_var_19 [56];
  undefined1 auVar44 [16];
  text_oarchive oa;
  ofstream out;
  Expression idloss_1;
  ComputationGraph cg_2;
  pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *spair_1;
  iterator __end3_2;
  iterator __begin3_2;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  *__range3_2;
  uint dchars_tt_1;
  uint dchars_t_1;
  uint dchars_s_1;
  double dloss_trace_1;
  double dloss_t2s_1;
  double dloss_s2t_1;
  double dloss_1;
  Expression iloss;
  value_type *spair;
  ComputationGraph cg_1;
  uint i_2;
  uint chars_tt;
  uint chars_t;
  uint chars_s;
  double loss_trace_1;
  double loss_t2s_1;
  double loss_s2t_1;
  double loss;
  Timer iteration;
  uint lines;
  int report;
  bool first;
  uint i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  uint si;
  uint dev_every_i_reports;
  uint report_every_i;
  int *w_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<int,_std::allocator<int>_> *__range3_1;
  int *w;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  double loss_trace;
  double loss_t2s;
  double loss_s2t;
  Expression idloss;
  ComputationGraph cg;
  uint i;
  uint dchars_tt;
  uint dchars_t;
  uint dchars_s;
  double dloss_trace;
  double dloss_t2s;
  double dloss_s2t;
  double dloss;
  text_iarchive ia;
  ifstream in;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  init_files;
  bool add_fer;
  BidirAttentionalModel<dynet::LSTMBuilder> am;
  SimpleSGDTrainer sgd;
  Model model;
  double best;
  ostringstream os;
  string fname;
  bool giza;
  string line;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  testing;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  dev;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  training;
  ifstream config;
  options_description opts;
  variables_map vm;
  Dict *in_stack_ffffffffffffd818;
  real in_stack_ffffffffffffd820;
  real in_stack_ffffffffffffd824;
  key_type *in_stack_ffffffffffffd828;
  Dict *in_stack_ffffffffffffd830;
  uint uVar45;
  ostream *in_stack_ffffffffffffd838;
  ostream *in_stack_ffffffffffffd840;
  int *in_stack_ffffffffffffd848;
  typed_value<int,_char> *in_stack_ffffffffffffd850;
  Timer *in_stack_ffffffffffffd860;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffd868;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffd870;
  string *in_stack_ffffffffffffd880;
  Dict *in_stack_ffffffffffffd888;
  undefined4 in_stack_ffffffffffffd8b0;
  float in_stack_ffffffffffffd8b4;
  Model *in_stack_ffffffffffffd8b8;
  BidirAttentionalModel<dynet::LSTMBuilder> *in_stack_ffffffffffffd8c0;
  undefined4 in_stack_ffffffffffffd8c8;
  float in_stack_ffffffffffffd8cc;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffd8d0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffd8d8;
  undefined4 in_stack_ffffffffffffd8e0;
  float in_stack_ffffffffffffd8e4;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffd8f8;
  undefined8 in_stack_ffffffffffffd900;
  int style;
  options_description *in_stack_ffffffffffffd908;
  char **in_stack_ffffffffffffd910;
  undefined8 in_stack_ffffffffffffd918;
  int argc_00;
  string *in_stack_ffffffffffffdb68;
  Dict *in_stack_ffffffffffffdba8;
  ComputationGraph *cg_00;
  allocator *target;
  AttentionalModel<dynet::LSTMBuilder> *this;
  Dict *in_stack_ffffffffffffdbe0;
  bool local_2291;
  bool local_2271;
  bool local_2251;
  undefined1 local_1e60 [512];
  size_type local_1c60;
  size_type local_1c58;
  VariableIndex local_1c4c;
  Model local_1c48 [4];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_1c44 [20];
  Expression local_1c30 [5];
  reference local_1be0;
  pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *local_1bd8;
  __normal_iterator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_1bd0;
  undefined1 *local_1bc8;
  int local_1bbc;
  int local_1bb8;
  int local_1bb4;
  double local_1bb0;
  double local_1ba8;
  double local_1ba0;
  double local_1b98;
  VariableIndex local_1b90;
  VariableIndex local_1b8c;
  VariableIndex local_1b88;
  VariableIndex local_1b84;
  VariableIndex local_1b80;
  VariableIndex local_1b7c [5];
  size_type local_1b68;
  size_type local_1b60;
  reference local_1b58;
  Expression local_1b50 [5];
  uint *local_1b00;
  uint *local_1af8;
  uint local_1af0;
  int local_1aec;
  int local_1ae8;
  int local_1ae4;
  double local_1ae0;
  double local_1ad8;
  double local_1ad0;
  double local_1ac8;
  allocator local_1ab9;
  string local_1ab8 [76];
  int local_1a6c;
  uint local_1a68;
  byte local_1a61;
  uint local_1a60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1a58;
  uint local_1a3c;
  uint local_1a38;
  uint local_1a34;
  size_type local_1a30;
  size_type local_1a28;
  reference local_1a20;
  int *local_1a18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1a10;
  vector<int,_std::allocator<int>_> *local_1a08;
  reference local_1a00;
  int *local_19f8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_19f0;
  reference local_19e8;
  VariableIndex local_19dc;
  double local_19d8;
  VariableIndex local_19cc;
  double local_19c8;
  VariableIndex local_19bc;
  double local_19b8;
  size_type local_19b0;
  size_type local_19a8 [3];
  Expression local_1990 [5];
  uint local_1940;
  int local_193c;
  int local_1938;
  int local_1934;
  double local_1930;
  double local_1928;
  double local_1920;
  double local_1918;
  allocator local_1909;
  string local_1908 [39];
  allocator local_18e1;
  string local_18e0 [160];
  undefined1 local_1840 [496];
  Model *in_stack_ffffffffffffe9b0;
  string *in_stack_ffffffffffffe9b8;
  string *in_stack_ffffffffffffe9c0;
  BidirAttentionalModel<dynet::LSTMBuilder> *in_stack_ffffffffffffe9c8;
  string local_1630 [32];
  undefined1 local_1610 [32];
  string local_15f0 [39];
  allocator local_15c9;
  string local_15c8 [39];
  byte local_15a1;
  VariableIndex local_be0 [4];
  VariableIndex local_bd0 [4];
  VariableIndex local_bc0 [2];
  Trainer local_bb8 [64];
  Model local_b78 [136];
  double local_af0;
  allocator local_ae1;
  string local_ae0 [39];
  allocator local_ab9;
  string local_ab8 [32];
  string local_a98 [32];
  ostringstream local_a78 [383];
  allocator local_8f9;
  string local_8f8 [32];
  string local_8d8 [37];
  byte local_8b3;
  byte local_8b2;
  allocator local_8b1;
  string local_8b0 [37];
  byte local_88b;
  byte local_88a;
  allocator local_889;
  string local_888 [37];
  byte local_863;
  byte local_862;
  allocator local_861;
  string local_860 [39];
  allocator local_839;
  string local_838 [38];
  byte local_812;
  allocator local_811;
  string local_810 [39];
  allocator local_7e9;
  string local_7e8 [39];
  allocator local_7c1;
  string local_7c0 [39];
  allocator local_799;
  string local_798 [39];
  allocator local_771;
  string local_770 [63];
  allocator local_731;
  string local_730 [39];
  allocator local_709;
  string local_708 [39];
  allocator local_6e1;
  string local_6e0 [63];
  allocator local_6a1;
  string local_6a0 [39];
  allocator local_679;
  string local_678 [39];
  allocator local_651;
  string local_650 [63];
  allocator local_611;
  string local_610 [32];
  string local_5f0 [32];
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_5d0;
  undefined1 local_5b8 [24];
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_5a0;
  allocator local_581;
  string local_580 [39];
  allocator local_559;
  string local_558 [39];
  allocator local_531;
  string local_530 [39];
  allocator local_509;
  string local_508 [32];
  undefined4 local_4e8;
  byte local_4e3;
  byte local_4e2;
  allocator local_4e1;
  string local_4e0 [37];
  byte local_4bb;
  byte local_4ba;
  allocator local_4b9;
  string local_4b8 [37];
  byte local_493;
  byte local_492;
  allocator local_491;
  string local_490 [39];
  allocator local_469;
  string local_468 [32];
  istream local_448 [47];
  allocator local_419;
  string local_418 [32];
  options_description local_3f8 [527];
  allocator local_1e9;
  string local_1e8 [32];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  basic_parsed_options local_1a8 [44];
  uint local_17c;
  uint local_178;
  uint local_174;
  undefined8 local_170 [3];
  allocator local_151;
  string local_150 [32];
  options_description local_130 [128];
  variables_map local_b0 [16];
  int local_4;
  undefined1 auVar23 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  
  argc_00 = (int)((ulong)in_stack_ffffffffffffd918 >> 0x20);
  style = (int)((ulong)in_stack_ffffffffffffd900 >> 0x20);
  local_4 = 0;
  dynet::initialize((int *)&stack0xfffffffffffffff8,(char ***)&stack0xfffffffffffffff0,false);
  boost::program_options::variables_map::variables_map(local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"Allowed options",&local_151);
  boost::program_options::options_description::options_description
            (local_130,local_150,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  local_170[0] = boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_170,"help");
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"config,c",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"train,t",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"devel,d",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"rescore,r",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"parameters,p",(char *)ptVar3);
  ptVar4 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"initialise,i",(char *)ptVar4);
  boost::program_options::value<int>();
  local_174 = LAYERS;
  ptVar5 = boost::program_options::typed_value<int,_char>::default_value
                     (in_stack_ffffffffffffd850,in_stack_ffffffffffffd848);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"layers,l",(char *)ptVar5);
  boost::program_options::value<int>();
  local_178 = ALIGN_DIM;
  ptVar5 = boost::program_options::typed_value<int,_char>::default_value
                     (in_stack_ffffffffffffd850,in_stack_ffffffffffffd848);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"align,a",(char *)ptVar5);
  boost::program_options::value<int>();
  local_17c = HIDDEN_DIM;
  ptVar5 = boost::program_options::typed_value<int,_char>::default_value
                     (in_stack_ffffffffffffd850,in_stack_ffffffffffffd848);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"hidden,h",(char *)ptVar5);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"bidirectional");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar2,"giza");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"gz-position");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"gz-markov");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"gz-fertility");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"curriculum");
  boost::program_options::options_description_easy_init::operator()(pcVar2,"fertility,f");
  local_1c8 = 0;
  uStack_1c0 = 0;
  uStack_1b8 = 0;
  uStack_1b0 = 0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)0x14a251);
  boost::program_options::parse_command_line<char>
            (argc_00,in_stack_ffffffffffffd910,in_stack_ffffffffffffd908,style,
             in_stack_ffffffffffffd8f8);
  boost::program_options::store(local_1a8,local_b0,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x14a2aa);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)0x14a2b7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"config",&local_1e9);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  if (sVar6 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_418,"config",&local_419);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
               (string *)in_stack_ffffffffffffd818);
    boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x14a3a4);
    uVar7 = std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_3f8,uVar7,8);
    std::__cxx11::string::~string(local_418);
    std::allocator<char>::~allocator((allocator<char> *)&local_419);
    boost::program_options::parse_config_file<char>(local_448,local_3f8,SUB81(local_130,0));
    boost::program_options::store(local_448,local_b0,false);
    boost::program_options::basic_parsed_options<char>::~basic_parsed_options
              ((basic_parsed_options<char> *)0x14a433);
    std::ifstream::~ifstream(local_3f8);
  }
  boost::program_options::notify(local_b0);
  std::allocator<char>::allocator();
  local_492 = 0;
  local_493 = 0;
  local_4ba = 0;
  local_4bb = 0;
  local_4e2 = 0;
  local_4e3 = 0;
  std::__cxx11::string::string(local_468,"help",&local_469);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
  bVar20 = true;
  if (sVar6 == 0) {
    std::allocator<char>::allocator();
    local_492 = 1;
    std::__cxx11::string::string(local_490,"train",&local_491);
    local_493 = 1;
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
    bVar20 = true;
    if (sVar6 == 1) {
      std::allocator<char>::allocator();
      local_4ba = 1;
      std::__cxx11::string::string(local_4b8,"devel",&local_4b9);
      local_4bb = 1;
      sVar6 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
      bVar20 = false;
      if (sVar6 != 1) {
        std::allocator<char>::allocator();
        local_4e2 = 1;
        std::__cxx11::string::string(local_4e0,"rescore",&local_4e1);
        local_4e3 = 1;
        sVar6 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         *)in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
        bVar20 = sVar6 != 1;
      }
    }
  }
  if ((local_4e3 & 1) != 0) {
    std::__cxx11::string::~string(local_4e0);
  }
  if ((local_4e2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  }
  if ((local_4bb & 1) != 0) {
    std::__cxx11::string::~string(local_4b8);
  }
  if ((local_4ba & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  }
  if ((local_493 & 1) != 0) {
    std::__cxx11::string::~string(local_490);
  }
  if ((local_492 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
  }
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  if (bVar20) {
    poVar8 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_130);
    std::operator<<(poVar8,"\n");
    local_4 = 1;
    local_4e8 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_508,"<s>",&local_509);
    kSRC_SOS = dynet::Dict::convert(in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
    std::__cxx11::string::~string(local_508);
    std::allocator<char>::~allocator((allocator<char> *)&local_509);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_530,"</s>",&local_531);
    kSRC_EOS = dynet::Dict::convert(in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
    std::__cxx11::string::~string(local_530);
    std::allocator<char>::~allocator((allocator<char> *)&local_531);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_558,"<s>",&local_559);
    kTGT_SOS = dynet::Dict::convert(in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
    std::__cxx11::string::~string(local_558);
    std::allocator<char>::~allocator((allocator<char> *)&local_559);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_580,"</s>",&local_581);
    kTGT_EOS = dynet::Dict::convert(in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
    std::__cxx11::string::~string(local_580);
    std::allocator<char>::~allocator((allocator<char> *)&local_581);
    std::
    vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)0x14acc7);
    std::
    vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)0x14acd4);
    std::
    vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)0x14ace1);
    std::__cxx11::string::string(local_5f0);
    poVar8 = std::operator<<((ostream *)&std::cerr,"Reading training data from ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_610,"train",&local_611);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
               (string *)in_stack_ffffffffffffd818);
    pbVar9 = boost::program_options::variable_value::as<std::__cxx11::string>
                       ((variable_value *)0x14ad6a);
    poVar8 = std::operator<<(poVar8,(string *)pbVar9);
    std::operator<<(poVar8,"...\n");
    std::__cxx11::string::~string(local_610);
    std::allocator<char>::~allocator((allocator<char> *)&local_611);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_650,"train",&local_651);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
               (string *)in_stack_ffffffffffffd818);
    boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x14ae22);
    read_corpus(in_stack_ffffffffffffdb68);
    std::
    vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::operator=((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)in_stack_ffffffffffffd830,
                (vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)in_stack_ffffffffffffd828);
    std::
    vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)in_stack_ffffffffffffd830);
    std::__cxx11::string::~string(local_650);
    std::allocator<char>::~allocator((allocator<char> *)&local_651);
    dynet::Dict::freeze(&sd);
    dynet::Dict::freeze(&td);
    VOCAB_SIZE_SRC = dynet::Dict::size((Dict *)0x14aeaf);
    VOCAB_SIZE_TGT = dynet::Dict::size((Dict *)0x14aed4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_678,"devel",&local_679);
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
    std::__cxx11::string::~string(local_678);
    std::allocator<char>::~allocator((allocator<char> *)&local_679);
    if (sVar6 != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Reading dev data from ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6a0,"devel",&local_6a1);
      boost::program_options::variables_map::operator[]
                ((variables_map *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
                 (string *)in_stack_ffffffffffffd818);
      pbVar9 = boost::program_options::variable_value::as<std::__cxx11::string>
                         ((variable_value *)0x14aff7);
      poVar8 = std::operator<<(poVar8,(string *)pbVar9);
      std::operator<<(poVar8,"...\n");
      std::__cxx11::string::~string(local_6a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6e0,"devel",&local_6e1);
      boost::program_options::variables_map::operator[]
                ((variables_map *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
                 (string *)in_stack_ffffffffffffd818);
      boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x14b0af);
      read_corpus(in_stack_ffffffffffffdb68);
      std::
      vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::operator=((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)in_stack_ffffffffffffd830,
                  (vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)in_stack_ffffffffffffd828);
      std::
      vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)in_stack_ffffffffffffd830);
      std::__cxx11::string::~string(local_6e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_708,"rescore",&local_709);
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
    std::__cxx11::string::~string(local_708);
    std::allocator<char>::~allocator((allocator<char> *)&local_709);
    if (sVar6 != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Reading test data from ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_730,"rescore",&local_731);
      boost::program_options::variables_map::operator[]
                ((variables_map *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
                 (string *)in_stack_ffffffffffffd818);
      pbVar9 = boost::program_options::variable_value::as<std::__cxx11::string>
                         ((variable_value *)0x14b4c5);
      poVar8 = std::operator<<(poVar8,(string *)pbVar9);
      std::operator<<(poVar8,"...\n");
      std::__cxx11::string::~string(local_730);
      std::allocator<char>::~allocator((allocator<char> *)&local_731);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_770,"rescore",&local_771);
      boost::program_options::variables_map::operator[]
                ((variables_map *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
                 (string *)in_stack_ffffffffffffd818);
      boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x14b57d);
      read_corpus(in_stack_ffffffffffffdb68);
      std::
      vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::operator=((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)in_stack_ffffffffffffd830,
                  (vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)in_stack_ffffffffffffd828);
      std::
      vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)in_stack_ffffffffffffd830);
      std::__cxx11::string::~string(local_770);
      std::allocator<char>::~allocator((allocator<char> *)&local_771);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_798,"layers",&local_799);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
               (string *)in_stack_ffffffffffffd818);
    puVar10 = (uint *)boost::program_options::variable_value::as<int>((variable_value *)0x14b719);
    LAYERS = *puVar10;
    std::__cxx11::string::~string(local_798);
    std::allocator<char>::~allocator((allocator<char> *)&local_799);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7c0,"align",&local_7c1);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
               (string *)in_stack_ffffffffffffd818);
    puVar10 = (uint *)boost::program_options::variable_value::as<int>((variable_value *)0x14b7af);
    ALIGN_DIM = *puVar10;
    std::__cxx11::string::~string(local_7c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7e8,"hidden",&local_7e9);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
               (string *)in_stack_ffffffffffffd818);
    puVar10 = (uint *)boost::program_options::variable_value::as<int>((variable_value *)0x14b845);
    HIDDEN_DIM = *puVar10;
    std::__cxx11::string::~string(local_7e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_810,"bidirectional",&local_811);
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
    BIDIR = sVar6 != 0;
    std::__cxx11::string::~string(local_810);
    std::allocator<char>::~allocator((allocator<char> *)&local_811);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_838,"giza",&local_839);
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
    bVar20 = sVar6 != 0;
    std::__cxx11::string::~string(local_838);
    std::allocator<char>::~allocator((allocator<char> *)&local_839);
    local_862 = 0;
    local_863 = 0;
    local_2251 = true;
    local_812 = bVar20;
    if (!bVar20) {
      std::allocator<char>::allocator();
      local_862 = 1;
      std::__cxx11::string::string(local_860,"gz-position",&local_861);
      local_863 = 1;
      sVar6 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
      local_2251 = sVar6 != 0;
    }
    GIZA_P = local_2251;
    if ((local_863 & 1) != 0) {
      std::__cxx11::string::~string(local_860);
    }
    if ((local_862 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_861);
    }
    local_88a = 0;
    local_88b = 0;
    local_2271 = true;
    if ((local_812 & 1) == 0) {
      std::allocator<char>::allocator();
      local_88a = 1;
      std::__cxx11::string::string(local_888,"gz-markov",&local_889);
      local_88b = 1;
      sVar6 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
      local_2271 = sVar6 != 0;
    }
    GIZA_M = local_2271;
    if ((local_88b & 1) != 0) {
      std::__cxx11::string::~string(local_888);
    }
    if ((local_88a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_889);
    }
    local_8b2 = 0;
    local_8b3 = 0;
    local_2291 = true;
    if ((local_812 & 1) == 0) {
      std::allocator<char>::allocator();
      local_8b2 = 1;
      std::__cxx11::string::string(local_8b0,"gz-fertility",&local_8b1);
      local_8b3 = 1;
      sVar6 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
      local_2291 = sVar6 != 0;
    }
    GIZA_F = local_2291;
    if ((local_8b3 & 1) != 0) {
      std::__cxx11::string::~string(local_8b0);
    }
    if ((local_8b2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
    }
    std::__cxx11::string::string(local_8d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8f8,"parameters",&local_8f9);
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
    std::__cxx11::string::~string(local_8f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
    if (sVar6 == 0) {
      std::__cxx11::ostringstream::ostringstream(local_a78);
      poVar8 = std::operator<<((ostream *)local_a78,"bam");
      poVar8 = std::operator<<(poVar8,'_');
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,LAYERS);
      poVar8 = std::operator<<(poVar8,'_');
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,HIDDEN_DIM);
      poVar8 = std::operator<<(poVar8,'_');
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,ALIGN_DIM);
      poVar8 = std::operator<<(poVar8,"_lstm");
      poVar8 = std::operator<<(poVar8,"_b");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(bool)(BIDIR & 1));
      poVar8 = std::operator<<(poVar8,"_g");
      pvVar18 = (void *)std::ostream::operator<<(poVar8,GIZA_P & 1);
      pvVar18 = (void *)std::ostream::operator<<(pvVar18,GIZA_M & 1);
      poVar8 = (ostream *)std::ostream::operator<<(pvVar18,GIZA_F & 1);
      poVar8 = std::operator<<(poVar8,"-pid");
      _Var1 = getpid();
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,_Var1);
      std::operator<<(poVar8,".params");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_8d8,local_a98);
      std::__cxx11::string::~string(local_a98);
      std::__cxx11::ostringstream::~ostringstream(local_a78);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ab8,"parameters",&local_ab9);
      boost::program_options::variables_map::operator[]
                ((variables_map *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
                 (string *)in_stack_ffffffffffffd818);
      pbVar9 = boost::program_options::variable_value::as<std::__cxx11::string>
                         ((variable_value *)0x14c327);
      std::__cxx11::string::operator=(local_8d8,(string *)pbVar9);
      std::__cxx11::string::~string(local_ab8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ae0,"initialise",&local_ae1);
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
    std::__cxx11::string::~string(local_ae0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
    if (sVar6 == 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Parameters will be written to: ");
      poVar8 = std::operator<<(poVar8,local_8d8);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    local_af0 = 9e+99;
    dynet::Model::Model(local_b78);
    dynet::SimpleSGDTrainer::SimpleSGDTrainer
              ((SimpleSGDTrainer *)in_stack_ffffffffffffd830,(Model *)in_stack_ffffffffffffd828,
               in_stack_ffffffffffffd824,in_stack_ffffffffffffd820);
    BidirAttentionalModel<dynet::LSTMBuilder>::BidirAttentionalModel
              (in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8,
               (double)CONCAT44(in_stack_ffffffffffffd8b4,in_stack_ffffffffffffd8b0));
    local_15a1 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_15c8,"rescore",&local_15c9);
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
    std::__cxx11::string::~string(local_15c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_15c9);
    if (sVar6 != 0) {
      BidirAttentionalModel<dynet::LSTMBuilder>::add_fertility_params
                ((BidirAttentionalModel<dynet::LSTMBuilder> *)
                 CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
                 (Model *)in_stack_ffffffffffffd818);
      local_15a1 = 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_15f0,"initialise",(allocator *)(local_1610 + 0x1f));
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
    std::__cxx11::string::~string(local_15f0);
    std::allocator<char>::~allocator((allocator<char> *)(local_1610 + 0x1f));
    if (sVar6 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1630,"initialise",(allocator *)&stack0xffffffffffffe9cf);
      boost::program_options::variables_map::operator[]
                ((variables_map *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
                 (string *)in_stack_ffffffffffffd818);
      boost::program_options::variable_value::
      as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((variable_value *)0x14c78c);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_ffffffffffffd870,in_stack_ffffffffffffd868);
      std::__cxx11::string::~string(local_1630);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffe9cf);
      sVar11 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1610);
      if (sVar11 == 1) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Parameters will be loaded from: ");
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_1610,0);
        poVar8 = std::operator<<(poVar8,(string *)pvVar12);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_1610,0);
        std::ifstream::ifstream(local_1840,pvVar12,8);
        boost::archive::text_iarchive::text_iarchive
                  ((text_iarchive *)in_stack_ffffffffffffd840,(istream *)in_stack_ffffffffffffd838,
                   (uint)((ulong)in_stack_ffffffffffffd830 >> 0x20));
        boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator>>
                  ((interface_iarchive<boost::archive::text_iarchive> *)
                   CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
                   (Model *)in_stack_ffffffffffffd818);
        boost::archive::text_iarchive::~text_iarchive((text_iarchive *)0x14c8a1);
        std::ifstream::~ifstream(local_1840);
      }
      else {
        sVar11 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1610);
        if (sVar11 != 2) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/biattentional.cc"
                        ,0x116,"int main(int, char **)");
        }
        poVar8 = std::operator<<((ostream *)&std::cerr,"initialising from ");
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_1610,0);
        poVar8 = std::operator<<(poVar8,(string *)pvVar12);
        poVar8 = std::operator<<(poVar8," and ");
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_1610,1);
        poVar8 = std::operator<<(poVar8,(string *)pvVar12);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        in_stack_ffffffffffffdbe0 = (Dict *)local_1610;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffdbe0,0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffdbe0,1);
        BidirAttentionalModel<dynet::LSTMBuilder>::initialise
                  (in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,in_stack_ffffffffffffe9b8,
                   in_stack_ffffffffffffe9b0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffd830);
    }
    this = (AttentionalModel<dynet::LSTMBuilder> *)&stack0xffffffffffffff60;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_18e0,"fertility",&local_18e1);
    source = (vector<int,_std::allocator<int>_> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
    FERT = source != (vector<int,_std::allocator<int>_> *)0x0;
    std::__cxx11::string::~string(local_18e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_18e1);
    if (((FERT & 1U) != 0) && ((local_15a1 & 1) == 0)) {
      BidirAttentionalModel<dynet::LSTMBuilder>::add_fertility_params
                ((BidirAttentionalModel<dynet::LSTMBuilder> *)
                 CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
                 (Model *)in_stack_ffffffffffffd818);
    }
    cg_00 = (ComputationGraph *)&stack0xffffffffffffff60;
    target = &local_1909;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1908,"rescore",target);
    alignment = (Expression *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         *)in_stack_ffffffffffffd830,in_stack_ffffffffffffd828);
    std::__cxx11::string::~string(local_1908);
    std::allocator<char>::~allocator((allocator<char> *)&local_1909);
    if (alignment == (Expression *)0x0) {
      local_1a34 = 0x32;
      local_1a38 = 500;
      sVar11 = std::
               vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::size(&local_5a0);
      local_1a3c = (uint)sVar11;
      std::
      vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::size(&local_5a0);
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x14d822);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffd840,
                 (size_type)in_stack_ffffffffffffd838,(allocator_type *)in_stack_ffffffffffffd830);
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x14d84e);
      for (local_1a60 = 0; uVar13 = (ulong)local_1a60,
          sVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_1a58),
          uVar45 = local_1a60, uVar13 < sVar11; local_1a60 = local_1a60 + 1) {
        pvVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&local_1a58,(ulong)local_1a60);
        *pvVar19 = uVar45;
      }
      local_1a61 = 1;
      local_1a68 = 0;
      local_1a6c = 0;
      do {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1ab8,"completed in",&local_1ab9);
        dynet::Timer::Timer((Timer *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
                            (string *)in_stack_ffffffffffffd818);
        std::__cxx11::string::~string(local_1ab8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1ab9);
        auVar33._8_56_ = extraout_var_08;
        auVar33._0_8_ = extraout_XMM1_Qa_07;
        local_1ac8 = 0.0;
        local_1ad0 = 0.0;
        local_1ad8 = 0.0;
        local_1ae0 = 0.0;
        local_1ae4 = 0;
        local_1ae8 = 0;
        local_1aec = 0;
        for (local_1af0 = 0; auVar44 = auVar33._0_16_, local_1af0 < local_1a34;
            local_1af0 = local_1af0 + 1) {
          uVar13 = (ulong)local_1a3c;
          sVar11 = std::
                   vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ::size(&local_5a0);
          if (uVar13 == sVar11) {
            local_1a3c = 0;
            if ((local_1a61 & 1) == 0) {
              dynet::Trainer::update_epoch(local_bb8,1.0);
            }
            else {
              local_1a61 = 0;
            }
            std::operator<<((ostream *)&std::cerr,"**SHUFFLE\n");
            local_1af8 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                            in_stack_ffffffffffffd818);
            local_1b00 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                            in_stack_ffffffffffffd818);
            __first._M_current._4_4_ = in_stack_ffffffffffffd8e4;
            __first._M_current._0_4_ = in_stack_ffffffffffffd8e0;
            std::
            shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
                      (__first,in_stack_ffffffffffffd8d8,in_stack_ffffffffffffd8d0);
          }
          dynet::ComputationGraph::ComputationGraph((ComputationGraph *)local_1b50);
          pvVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&local_1a58,(ulong)local_1a3c);
          local_1b58 = std::
                       vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[](&local_5a0,(ulong)*pvVar19);
          sVar11 = std::vector<int,_std::allocator<int>_>::size(&local_1b58->first);
          local_1ae4 = (int)sVar11 + -1 + local_1ae4;
          sVar11 = std::vector<int,_std::allocator<int>_>::size(&local_1b58->second);
          local_1ae8 = (int)sVar11 + -1 + local_1ae8;
          local_1b60 = std::vector<int,_std::allocator<int>_>::size(&local_1b58->first);
          local_1b68 = std::vector<int,_std::allocator<int>_>::size(&local_1b58->second);
          puVar15 = std::max<unsigned_long>(&local_1b60,&local_1b68);
          local_1aec = (int)*puVar15 + -1 + local_1aec;
          local_1a3c = local_1a3c + 1;
          BidirAttentionalModel<dynet::LSTMBuilder>::build_graph
                    ((BidirAttentionalModel<dynet::LSTMBuilder> *)
                     CONCAT44(in_stack_ffffffffffffd8cc,in_stack_ffffffffffffd8c8),
                     (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd8c0,
                     (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd8b8,
                     (ComputationGraph *)
                     CONCAT44(in_stack_ffffffffffffd8b4,in_stack_ffffffffffffd8b0));
          pTVar16 = (Tensor *)dynet::ComputationGraph::forward(local_1b50);
          fVar21 = (float)dynet::as_scalar(pTVar16);
          local_1ac8 = local_1ac8 + (double)fVar21;
          dynet::VariableIndex::VariableIndex(local_1b7c,local_be0);
          pTVar16 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_1b50);
          fVar21 = (float)dynet::as_scalar(pTVar16);
          local_1ad0 = local_1ad0 + (double)fVar21;
          dynet::VariableIndex::VariableIndex(&local_1b80,local_bd0);
          pTVar16 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_1b50);
          fVar21 = (float)dynet::as_scalar(pTVar16);
          local_1ad8 = local_1ad8 + (double)fVar21;
          dynet::VariableIndex::VariableIndex(&local_1b84,local_bc0);
          pTVar16 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_1b50);
          fVar21 = (float)dynet::as_scalar(pTVar16);
          local_1ae0 = local_1ae0 + (double)fVar21;
          dynet::ComputationGraph::backward(local_1b50);
          dynet::Trainer::update(1.0);
          local_1a6c = local_1a6c + 1;
          if (local_1a3c == 1) {
            dynet::AttentionalModel<dynet::LSTMBuilder>::display_ascii
                      (this,source,(vector<int,_std::allocator<int>_> *)target,cg_00,alignment,
                       in_stack_ffffffffffffdba8,in_stack_ffffffffffffdbe0);
            in_stack_ffffffffffffd818 = &sd;
            dynet::AttentionalModel<dynet::LSTMBuilder>::display_ascii
                      (this,source,(vector<int,_std::allocator<int>_> *)target,cg_00,alignment,
                       in_stack_ffffffffffffdba8,in_stack_ffffffffffffdbe0);
            poVar8 = std::operator<<((ostream *)&std::cerr,"\txent_s2t ");
            dynet::VariableIndex::VariableIndex(&local_1b88,local_be0);
            pTVar16 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_1b50);
            fVar21 = (float)dynet::as_scalar(pTVar16);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,fVar21);
            poVar8 = std::operator<<(poVar8,"\txent_t2s ");
            dynet::VariableIndex::VariableIndex(&local_1b8c,local_bd0);
            pTVar16 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_1b50);
            fVar21 = (float)dynet::as_scalar(pTVar16);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,fVar21);
            poVar8 = std::operator<<(poVar8,"\ttrace ");
            dynet::VariableIndex::VariableIndex(&local_1b90,local_bc0);
            pTVar16 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_1b50);
            fVar21 = (float)dynet::as_scalar(pTVar16);
            pvVar18 = (void *)std::ostream::operator<<(poVar8,fVar21);
            std::ostream::operator<<(pvVar18,std::endl<char,std::char_traits<char>>);
          }
          dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)local_1b50);
          auVar33._8_56_ = extraout_var_09;
          auVar33._0_8_ = extraout_XMM1_Qa_08;
        }
        dynet::Trainer::status
                  ((Trainer *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
        poVar8 = std::operator<<((ostream *)&std::cerr," E = ");
        auVar44 = vcvtusi2sd_avx512f(auVar44,local_1ae4 + local_1ae8);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_1ac8 / auVar44._0_8_);
        auVar34._8_56_ = extraout_var_10;
        auVar34._0_8_ = extraout_XMM1_Qa_09;
        auVar44 = auVar34._0_16_;
        poVar8 = std::operator<<(poVar8," ppl=");
        auVar44 = vcvtusi2sd_avx512f(auVar44,local_1ae4 + local_1ae8);
        dVar22 = exp(local_1ac8 / auVar44._0_8_);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,dVar22);
        auVar35._8_56_ = extraout_var_11;
        auVar35._0_8_ = extraout_XMM1_Qa_10;
        auVar44 = auVar35._0_16_;
        std::operator<<(poVar8,' ');
        poVar8 = std::operator<<((ostream *)&std::cerr," ppl_s = ");
        auVar44 = vcvtusi2sd_avx512f(auVar44,local_1ae4);
        dVar22 = exp(local_1ad8 / auVar44._0_8_);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,dVar22);
        auVar36._8_56_ = extraout_var_12;
        auVar36._0_8_ = extraout_XMM1_Qa_11;
        auVar44 = auVar36._0_16_;
        std::operator<<(poVar8,' ');
        poVar8 = std::operator<<((ostream *)&std::cerr," ppl_t = ");
        auVar44 = vcvtusi2sd_avx512f(auVar44,local_1ae8);
        dVar22 = exp(local_1ad0 / auVar44._0_8_);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,dVar22);
        auVar37._8_56_ = extraout_var_13;
        auVar37._0_8_ = extraout_XMM1_Qa_12;
        auVar44 = auVar37._0_16_;
        std::operator<<(poVar8,' ');
        poVar8 = std::operator<<((ostream *)&std::cerr," trace = ");
        auVar44 = vcvtusi2sd_avx512f(auVar44,local_1aec);
        dVar22 = exp(local_1ae0 / auVar44._0_8_);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,dVar22);
        std::operator<<(poVar8,' ');
        local_1a68 = local_1a68 + 1;
        if (local_1a68 % local_1a38 == 0) {
          local_1b98 = 0.0;
          local_1ba0 = 0.0;
          local_1ba8 = 0.0;
          local_1bb0 = 0.0;
          local_1bb4 = 0;
          local_1bb8 = 0;
          local_1bbc = 0;
          local_1bc8 = local_5b8;
          local_1bd0._M_current =
               (pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
                *)std::
                  vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::begin((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                           *)in_stack_ffffffffffffd818);
          local_1bd8 = (pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
                        *)std::
                          vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                          ::end((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                 *)in_stack_ffffffffffffd818);
          while( true ) {
            bVar20 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
                                (__normal_iterator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>_>
                                 *)in_stack_ffffffffffffd818);
            uVar45 = (uint)((ulong)in_stack_ffffffffffffd830 >> 0x20);
            if (!bVar20) break;
            local_1be0 = __gnu_cxx::
                         __normal_iterator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>_>
                         ::operator*(&local_1bd0);
            dynet::ComputationGraph::ComputationGraph((ComputationGraph *)local_1c30);
            BidirAttentionalModel<dynet::LSTMBuilder>::build_graph
                      ((BidirAttentionalModel<dynet::LSTMBuilder> *)
                       CONCAT44(in_stack_ffffffffffffd8cc,in_stack_ffffffffffffd8c8),
                       (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd8c0,
                       (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd8b8,
                       (ComputationGraph *)
                       CONCAT44(in_stack_ffffffffffffd8b4,in_stack_ffffffffffffd8b0));
            pTVar16 = (Tensor *)dynet::ComputationGraph::incremental_forward(local_1c30);
            in_stack_ffffffffffffd8e4 = (float)dynet::as_scalar(pTVar16);
            local_1b98 = local_1b98 + (double)in_stack_ffffffffffffd8e4;
            in_stack_ffffffffffffd8d0 = local_1c44;
            dynet::VariableIndex::VariableIndex
                      ((VariableIndex *)in_stack_ffffffffffffd8d0,local_be0);
            in_stack_ffffffffffffd8d8._M_current =
                 (uint *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_1c30);
            in_stack_ffffffffffffd8cc =
                 (float)dynet::as_scalar((Tensor *)in_stack_ffffffffffffd8d8._M_current);
            local_1ba0 = local_1ba0 + (double)in_stack_ffffffffffffd8cc;
            in_stack_ffffffffffffd8b8 = local_1c48;
            dynet::VariableIndex::VariableIndex
                      ((VariableIndex *)in_stack_ffffffffffffd8b8,local_bd0);
            in_stack_ffffffffffffd8c0 =
                 (BidirAttentionalModel<dynet::LSTMBuilder> *)
                 dynet::ComputationGraph::get_value((VariableIndex)(uint)local_1c30);
            in_stack_ffffffffffffd8b4 = (float)dynet::as_scalar((Tensor *)in_stack_ffffffffffffd8c0)
            ;
            local_1ba8 = local_1ba8 + (double)in_stack_ffffffffffffd8b4;
            dynet::VariableIndex::VariableIndex(&local_1c4c,local_bc0);
            pTVar16 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_1c30);
            fVar21 = (float)dynet::as_scalar(pTVar16);
            local_1bb0 = local_1bb0 + (double)fVar21;
            sVar11 = std::vector<int,_std::allocator<int>_>::size(&local_1be0->first);
            local_1bb4 = (int)sVar11 + -1 + local_1bb4;
            sVar11 = std::vector<int,_std::allocator<int>_>::size(&local_1be0->second);
            local_1bb8 = (int)sVar11 + -1 + local_1bb8;
            local_1c58 = std::vector<int,_std::allocator<int>_>::size(&local_1be0->first);
            local_1c60 = std::vector<int,_std::allocator<int>_>::size(&local_1be0->second);
            puVar15 = std::max<unsigned_long>(&local_1c58,&local_1c60);
            local_1bbc = local_1bbc + (int)*puVar15 + -1;
            dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)local_1c30);
            __gnu_cxx::
            __normal_iterator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>_>
            ::operator++(&local_1bd0);
          }
          auVar24._8_8_ = 0;
          auVar24._0_8_ = local_1b98;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = local_af0;
          if (local_1b98 < local_af0) {
            local_af0 = local_1b98;
            std::ofstream::ofstream(local_1e60,local_8d8,0x10);
            boost::archive::text_oarchive::text_oarchive
                      ((text_oarchive *)in_stack_ffffffffffffd840,in_stack_ffffffffffffd838,uVar45);
            boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator<<
                      ((interface_oarchive<boost::archive::text_oarchive> *)
                       CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
                       (Model *)in_stack_ffffffffffffd818);
            boost::archive::text_oarchive::~text_oarchive((text_oarchive *)0x14e763);
            auVar44 = std::ofstream::~ofstream(local_1e60);
            auVar38._0_8_ = auVar44._8_8_;
            auVar23._0_8_ = auVar44._0_8_;
            auVar38._8_56_ = extraout_var_14;
            auVar24 = auVar38._0_16_;
            auVar23._8_56_ = extraout_var;
            auVar44 = auVar23._0_16_;
          }
          poVar8 = std::operator<<((ostream *)&std::cerr,"\n***DEV [epoch=");
          auVar44 = vcvtusi2sd_avx512f(auVar44,local_1a6c);
          sVar11 = std::
                   vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ::size(&local_5a0);
          auVar24 = vcvtusi2sd_avx512f(auVar24,sVar11);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,auVar44._0_8_ / auVar24._0_8_);
          auVar39._8_56_ = extraout_var_15;
          auVar39._0_8_ = extraout_XMM1_Qa_13;
          auVar44 = auVar39._0_16_;
          std::operator<<(poVar8,"]");
          poVar8 = std::operator<<((ostream *)&std::cerr," E = ");
          auVar44 = vcvtusi2sd_avx512f(auVar44,local_1bb4 + local_1bb8);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_1b98 / auVar44._0_8_);
          auVar40._8_56_ = extraout_var_16;
          auVar40._0_8_ = extraout_XMM1_Qa_14;
          auVar44 = auVar40._0_16_;
          in_stack_ffffffffffffd860 = (Timer *)std::operator<<(poVar8," ppl=");
          auVar44 = vcvtusi2sd_avx512f(auVar44,local_1bb4 + local_1bb8);
          dVar22 = exp(local_1b98 / auVar44._0_8_);
          poVar8 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffd860,dVar22);
          auVar41._8_56_ = extraout_var_17;
          auVar41._0_8_ = extraout_XMM1_Qa_15;
          auVar44 = auVar41._0_16_;
          std::operator<<(poVar8,' ');
          poVar8 = std::operator<<((ostream *)&std::cerr," ppl_s = ");
          auVar44 = vcvtusi2sd_avx512f(auVar44,local_1bb4);
          dVar22 = exp(local_1ba8 / auVar44._0_8_);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,dVar22);
          auVar42._8_56_ = extraout_var_18;
          auVar42._0_8_ = extraout_XMM1_Qa_16;
          auVar44 = auVar42._0_16_;
          std::operator<<(poVar8,' ');
          in_stack_ffffffffffffd840 = std::operator<<((ostream *)&std::cerr," ppl_t = ");
          auVar44 = vcvtusi2sd_avx512f(auVar44,local_1bb8);
          dVar22 = exp(local_1ba0 / auVar44._0_8_);
          in_stack_ffffffffffffd838 =
               (ostream *)std::ostream::operator<<(in_stack_ffffffffffffd840,dVar22);
          auVar43._8_56_ = extraout_var_19;
          auVar43._0_8_ = extraout_XMM1_Qa_17;
          auVar44 = auVar43._0_16_;
          std::operator<<(in_stack_ffffffffffffd838,' ');
          in_stack_ffffffffffffd830 = (Dict *)std::operator<<((ostream *)&std::cerr," trace = ");
          auVar44 = vcvtusi2sd_avx512f(auVar44,local_1bbc);
          dVar22 = exp(local_1bb0 / auVar44._0_8_);
          poVar8 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffd830,dVar22);
          std::operator<<(poVar8,' ');
        }
        dynet::Timer::~Timer(in_stack_ffffffffffffd860);
      } while( true );
    }
    local_1918 = 0.0;
    local_1920 = 0.0;
    local_1928 = 0.0;
    local_1930 = 0.0;
    local_1934 = 0;
    local_1938 = 0;
    local_193c = 0;
    local_1940 = 0;
    while( true ) {
      uVar13 = (ulong)local_1940;
      sVar11 = std::
               vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::size(&local_5d0);
      if (sVar11 <= uVar13) break;
      dynet::ComputationGraph::ComputationGraph((ComputationGraph *)local_1990);
      std::
      vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::operator[](&local_5d0,(ulong)local_1940);
      std::
      vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::operator[](&local_5d0,(ulong)local_1940);
      BidirAttentionalModel<dynet::LSTMBuilder>::build_graph
                ((BidirAttentionalModel<dynet::LSTMBuilder> *)
                 CONCAT44(in_stack_ffffffffffffd8cc,in_stack_ffffffffffffd8c8),
                 (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd8c0,
                 (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd8b8,
                 (ComputationGraph *)CONCAT44(in_stack_ffffffffffffd8b4,in_stack_ffffffffffffd8b0));
      pvVar14 = std::
                vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&local_5d0,(ulong)local_1940);
      sVar11 = std::vector<int,_std::allocator<int>_>::size(&pvVar14->first);
      local_1934 = (int)sVar11 + -1 + local_1934;
      pvVar14 = std::
                vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&local_5d0,(ulong)local_1940);
      sVar11 = std::vector<int,_std::allocator<int>_>::size(&pvVar14->second);
      local_1938 = (int)sVar11 + -1 + local_1938;
      pvVar14 = std::
                vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&local_5d0,(ulong)local_1940);
      local_19a8[0] = std::vector<int,_std::allocator<int>_>::size(&pvVar14->first);
      pvVar14 = std::
                vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&local_5d0,(ulong)local_1940);
      local_19b0 = std::vector<int,_std::allocator<int>_>::size(&pvVar14->second);
      puVar15 = std::max<unsigned_long>(local_19a8,&local_19b0);
      local_193c = (int)*puVar15 + -1 + local_193c;
      pTVar16 = (Tensor *)dynet::ComputationGraph::forward(local_1990);
      fVar21 = (float)dynet::as_scalar(pTVar16);
      local_1918 = local_1918 + (double)fVar21;
      dynet::VariableIndex::VariableIndex(&local_19bc,local_be0);
      pTVar16 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_1990);
      fVar21 = (float)dynet::as_scalar(pTVar16);
      local_19b8 = (double)fVar21;
      dynet::VariableIndex::VariableIndex(&local_19cc,local_bd0);
      pTVar16 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_1990);
      fVar21 = (float)dynet::as_scalar(pTVar16);
      local_19c8 = (double)fVar21;
      dynet::VariableIndex::VariableIndex(&local_19dc,local_bc0);
      pTVar16 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_1990);
      fVar21 = (float)dynet::as_scalar(pTVar16);
      local_19d8 = (double)fVar21;
      local_1920 = local_1920 + local_19b8;
      local_1928 = local_1928 + local_19c8;
      local_1930 = local_1930 + local_19d8;
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,local_1940);
      auVar25._8_56_ = extraout_var_00;
      auVar25._0_8_ = extraout_XMM1_Qa;
      std::operator<<(poVar8," |||");
      local_19e8 = std::
                   vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ::operator[](&local_5d0,(ulong)local_1940);
      local_19f0._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd818);
      local_19f8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd818)
      ;
      while (bVar20 = __gnu_cxx::operator!=
                                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
                                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)in_stack_ffffffffffffd818), bVar20) {
        local_1a00 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_19f0);
        poVar8 = std::operator<<((ostream *)&std::cout," ");
        psVar17 = dynet::Dict::convert_abi_cxx11_
                            (in_stack_ffffffffffffd830,(int *)in_stack_ffffffffffffd828);
        std::operator<<(poVar8,(string *)psVar17);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_19f0);
      }
      std::operator<<((ostream *)&std::cout," |||");
      pvVar14 = std::
                vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&local_5d0,(ulong)local_1940);
      local_1a08 = &pvVar14->second;
      local_1a10._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd818);
      local_1a18 = (int *)std::vector<int,_std::allocator<int>_>::end
                                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd818)
      ;
      while( true ) {
        bVar20 = __gnu_cxx::operator!=
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820),
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_ffffffffffffd818);
        auVar44 = auVar25._0_16_;
        if (!bVar20) break;
        local_1a20 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_1a10);
        poVar8 = std::operator<<((ostream *)&std::cout," ");
        psVar17 = dynet::Dict::convert_abi_cxx11_
                            (in_stack_ffffffffffffd830,(int *)in_stack_ffffffffffffd828);
        std::operator<<(poVar8,(string *)psVar17);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_1a10);
      }
      poVar8 = std::operator<<((ostream *)&std::cout," ||| ");
      dVar22 = local_19b8;
      pvVar14 = std::
                vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&local_5d0,(ulong)local_1940);
      sVar11 = std::vector<int,_std::allocator<int>_>::size(&pvVar14->second);
      auVar44 = vcvtusi2sd_avx512f(auVar44,sVar11 - 1);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,dVar22 / auVar44._0_8_);
      auVar26._8_56_ = extraout_var_01;
      auVar26._0_8_ = extraout_XMM1_Qa_00;
      auVar44 = auVar26._0_16_;
      poVar8 = std::operator<<(poVar8," ");
      dVar22 = local_19c8;
      pvVar14 = std::
                vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&local_5d0,(ulong)local_1940);
      sVar11 = std::vector<int,_std::allocator<int>_>::size(&pvVar14->first);
      auVar44 = vcvtusi2sd_avx512f(auVar44,sVar11 - 1);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,dVar22 / auVar44._0_8_);
      auVar27._8_56_ = extraout_var_02;
      auVar27._0_8_ = extraout_XMM1_Qa_01;
      auVar44 = auVar27._0_16_;
      poVar8 = std::operator<<(poVar8," ");
      dVar22 = local_19d8;
      pvVar14 = std::
                vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&local_5d0,(ulong)local_1940);
      local_1a28 = std::vector<int,_std::allocator<int>_>::size(&pvVar14->first);
      pvVar14 = std::
                vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&local_5d0,(ulong)local_1940);
      local_1a30 = std::vector<int,_std::allocator<int>_>::size(&pvVar14->second);
      puVar15 = std::max<unsigned_long>(&local_1a28,&local_1a30);
      auVar44 = vcvtusi2sd_avx512f(auVar44,*puVar15 - 1);
      pvVar18 = (void *)std::ostream::operator<<(poVar8,dVar22 / auVar44._0_8_);
      std::ostream::operator<<(pvVar18,std::endl<char,std::char_traits<char>>);
      dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)local_1990);
      local_1940 = local_1940 + 1;
    }
    poVar8 = (ostream *)std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    auVar28._8_56_ = extraout_var_03;
    auVar28._0_8_ = extraout_XMM1_Qa_02;
    auVar44 = auVar28._0_16_;
    poVar8 = std::operator<<(poVar8," E = ");
    auVar44 = vcvtusi2sd_avx512f(auVar44,local_1934 + local_1938);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_1918 / auVar44._0_8_);
    auVar29._8_56_ = extraout_var_04;
    auVar29._0_8_ = extraout_XMM1_Qa_03;
    auVar44 = auVar29._0_16_;
    poVar8 = std::operator<<(poVar8," ppl=");
    auVar44 = vcvtusi2sd_avx512f(auVar44,local_1934 + local_1938);
    dVar22 = exp(local_1918 / auVar44._0_8_);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,dVar22);
    auVar30._8_56_ = extraout_var_05;
    auVar30._0_8_ = extraout_XMM1_Qa_04;
    auVar44 = auVar30._0_16_;
    std::operator<<(poVar8,' ');
    poVar8 = std::operator<<((ostream *)&std::cerr," ppl_s = ");
    auVar44 = vcvtusi2sd_avx512f(auVar44,local_1934);
    dVar22 = exp(local_1928 / auVar44._0_8_);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,dVar22);
    auVar31._8_56_ = extraout_var_06;
    auVar31._0_8_ = extraout_XMM1_Qa_05;
    auVar44 = auVar31._0_16_;
    std::operator<<(poVar8,' ');
    poVar8 = std::operator<<((ostream *)&std::cerr," ppl_t = ");
    auVar44 = vcvtusi2sd_avx512f(auVar44,local_1938);
    dVar22 = exp(local_1920 / auVar44._0_8_);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,dVar22);
    auVar32._8_56_ = extraout_var_07;
    auVar32._0_8_ = extraout_XMM1_Qa_06;
    auVar44 = auVar32._0_16_;
    std::operator<<(poVar8,' ');
    poVar8 = std::operator<<((ostream *)&std::cerr," trace = ");
    auVar44 = vcvtusi2sd_avx512f(auVar44,local_193c);
    dVar22 = exp(local_1930 / auVar44._0_8_);
    pvVar18 = (void *)std::ostream::operator<<(poVar8,dVar22);
    std::ostream::operator<<(pvVar18,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    local_4e8 = 1;
    BidirAttentionalModel<dynet::LSTMBuilder>::~BidirAttentionalModel
              ((BidirAttentionalModel<dynet::LSTMBuilder> *)
               CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
    dynet::SimpleSGDTrainer::~SimpleSGDTrainer((SimpleSGDTrainer *)0x14d773);
    dynet::Model::~Model(local_b78);
    std::__cxx11::string::~string(local_8d8);
    std::__cxx11::string::~string(local_5f0);
    std::
    vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)in_stack_ffffffffffffd830);
    std::
    vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)in_stack_ffffffffffffd830);
    std::
    vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)in_stack_ffffffffffffd830);
  }
  boost::program_options::options_description::~options_description
            ((options_description *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
  boost::program_options::variables_map::~variables_map
            ((variables_map *)CONCAT44(in_stack_ffffffffffffd824,in_stack_ffffffffffffd820));
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
    dynet::initialize(argc, argv);

    // command line processing
    variables_map vm; 
    options_description opts("Allowed options");
    opts.add_options()
        ("help", "print help message")
        ("config,c", value<string>(), "config file specifying additional command line options")
        ("train,t", value<string>(), "file containing training sentences, with "
            "each line consisting of source ||| target.")
        ("devel,d", value<string>(), "file containing development sentences.")
        ("rescore,r", value<string>(), "rescore (source, target) sentence pairs")
        ("parameters,p", value<string>(), "save best parameters to this file")
        ("initialise,i", value<vector<string>>(), "load initial parameters from file")
        ("layers,l", value<int>()->default_value(LAYERS), "use <num> layers for RNN components")
        ("align,a", value<int>()->default_value(ALIGN_DIM), "use <num> dimensions for alignment projection")
        ("hidden,h", value<int>()->default_value(HIDDEN_DIM), "use <num> dimensions for recurrent hidden states")
        ("bidirectional", "use bidirectional recurrent hidden states as source embeddings, rather than word embeddings")
        ("giza", "use GIZA++ style features in attentional components (corresponds to all of the 'gz' options)")
        ("gz-position", "use GIZA++ positional index features")
        ("gz-markov", "use GIZA++ markov context features")
        ("gz-fertility", "use GIZA++ fertility type features")
        ("curriculum", "use 'curriculum' style learning, focusing on easy problems in earlier epochs")
        ("fertility,f", "learn Normal model of word fertility values")
    ;
    store(parse_command_line(argc, argv, opts), vm); 
    if (vm.count("config") > 0)
    {
        ifstream config(vm["config"].as<string>().c_str());
        store(parse_config_file(config, opts), vm); 
    }
    notify(vm);
    
    if (vm.count("help") || vm.count("train") != 1 || (vm.count("devel") != 1 && vm.count("rescore") != 1)) {
        cout << opts << "\n";
        return 1;
    }

    kSRC_SOS = sd.convert("<s>");
    kSRC_EOS = sd.convert("</s>");
    kTGT_SOS = td.convert("<s>");
    kTGT_EOS = td.convert("</s>");

    typedef vector<int> Sentence;
    typedef pair<Sentence, Sentence> SentencePair;
    vector<SentencePair> training, dev, testing;
    string line;
    cerr << "Reading training data from " << vm["train"].as<string>() << "...\n";
    training = read_corpus(vm["train"].as<string>());
    sd.freeze(); // no new word types allowed
    td.freeze(); // no new word types allowed
    VOCAB_SIZE_SRC = sd.size();
    VOCAB_SIZE_TGT = td.size();

    if (vm.count("devel")) {
        cerr << "Reading dev data from " << vm["devel"].as<string>() << "...\n";
        dev = read_corpus(vm["devel"].as<string>());
    }

    if (vm.count("rescore")) {
        cerr << "Reading test data from " << vm["rescore"].as<string>() << "...\n";
        testing = read_corpus(vm["rescore"].as<string>());
    }

    LAYERS = vm["layers"].as<int>(); 
    ALIGN_DIM = vm["align"].as<int>(); 
    HIDDEN_DIM = vm["hidden"].as<int>(); 
    BIDIR = vm.count("bidirectional");
    bool giza = vm.count("giza");
    GIZA_P = giza || vm.count("gz-position");
    GIZA_M = giza || vm.count("gz-markov");
    GIZA_F = giza || vm.count("gz-fertility");
    //FERT = vm.count("fertility");

    string fname;
    if (!vm.count("parameters")) {
        ostringstream os;
        os << "bam"
            << '_' << LAYERS
            << '_' << HIDDEN_DIM
            << '_' << ALIGN_DIM
            << "_lstm"
            << "_b" << BIDIR
	    << "_g" << (int)GIZA_P << (int)GIZA_M << (int)GIZA_F
            << "-pid" << getpid() << ".params";
        fname = os.str();
    }
    else {
        fname = vm["parameters"].as<string>();
    }

    if (!vm.count("initialise")) cerr << "Parameters will be written to: " << fname << endl;

    double best = 9e+99;

    Model model;
    SimpleSGDTrainer sgd(model);
    BidirAttentionalModel<LSTMBuilder> am(&model, 0.1);

    bool add_fer = false;
    if (vm.count("rescore"))
    {
    	am.add_fertility_params(&model);
    	add_fer = true;
    }

    if (vm.count("initialise")) {
        vector<string> init_files = vm["initialise"].as<vector<string>>();
        if (init_files.size() == 1) {
        	cerr << "Parameters will be loaded from: " << init_files[0] << endl;

            ifstream in(init_files[0]);
            boost::archive::text_iarchive ia(in);
            ia >> model;
        } else if (init_files.size() == 2) {
            cerr << "initialising from " << init_files[0] << " and " << init_files[1] << endl;
            am.initialise(init_files[0], init_files[1], model);
        } else {
            assert(false);
        }
    }

    FERT = vm.count("fertility");
    if (FERT && !add_fer) am.add_fertility_params(&model);

        if (false) {
            double dloss = 0, dloss_s2t = 0, dloss_t2s = 0, dloss_trace = 0;
            unsigned dchars_s = 0, dchars_t = 0, dchars_tt = 0;
            unsigned i = 0;
            for (auto& spair : dev) {
                ComputationGraph cg;
                auto idloss = am.build_graph(spair.first, spair.second, cg);
                dloss += as_scalar(cg.incremental_forward(idloss));
                dloss_s2t += as_scalar(cg.get_value(am.s2t_xent.i));
                dloss_t2s += as_scalar(cg.get_value(am.t2s_xent.i));
                dloss_trace += as_scalar(cg.get_value(am.trace_bonus.i));
                dchars_s += spair.first.size() - 1;
                dchars_t += spair.second.size() - 1;
                dchars_tt += std::max(spair.first.size(), spair.second.size()) - 1;

                if (true)
                {
                    cout << "\n===== SENTENCE " << i++ << " =====\n";
                    am.s2t_model.display_tikz(spair.first, spair.second, cg, am.s2t_align, sd, td);
                    cout << "\n";
                    am.t2s_model.display_tikz(spair.second, spair.first, cg, am.t2s_align, td, sd);
                    cout << "\n";
                }
            }
            if (dloss < best) {
                best = dloss;
                ofstream out(fname);
                boost::archive::text_oarchive oa(out);
                oa << model;
            }
            cerr << "\n***DEV [epoch=0]";
            cerr << " E = " << (dloss / (dchars_s + dchars_t)) << " ppl=" << exp(dloss / (dchars_s + dchars_t)) << ' '; // kind of hacky, as trace should be normalised differently
            cerr << " ppl_s = " << exp(dloss_t2s / dchars_s) << ' ';
            cerr << " ppl_t = " << exp(dloss_s2t / dchars_t) << ' ';
            cerr << " trace = " << exp(dloss_trace / dchars_tt) << ' ';
        }

    if (vm.count("rescore")) {
    	double dloss = 0, dloss_s2t = 0, dloss_t2s = 0, dloss_trace = 0;
    	unsigned dchars_s = 0, dchars_t = 0, dchars_tt = 0;
    	for (unsigned i = 0; i < testing.size(); ++i) {
            ComputationGraph cg;
            auto idloss = am.build_graph(testing[i].first, testing[i].second, cg);

            dchars_s += testing[i].first.size() - 1;
            dchars_t += testing[i].second.size() - 1;
            dchars_tt += std::max(testing[i].first.size(), testing[i].second.size()) - 1; // max or min?

            //cg.forward();
            dloss += as_scalar(cg.forward(idloss));

            double loss_s2t = as_scalar(cg.get_value(am.s2t_xent.i));
            double loss_t2s = as_scalar(cg.get_value(am.t2s_xent.i));
            double loss_trace = as_scalar(cg.get_value(am.trace_bonus.i));

            dloss_s2t += loss_s2t;
            dloss_t2s += loss_t2s;
            dloss_trace += loss_trace;

            cout << i << " |||";
            for (auto &w: testing[i].first)
                cout << " " << sd.convert(w);
            cout << " |||";
            for (auto &w: testing[i].second)
                cout << " " << td.convert(w);
            cout << " ||| " << (loss_s2t / (testing[i].second.size()-1))
                << " " << (loss_t2s / (testing[i].first.size()-1))
                << " " << (loss_trace / (std::max(testing[i].first.size(), testing[i].second.size())-1)) 
                << std::endl;
        }

    	cerr <<endl << " E = " << (dloss / (dchars_s + dchars_t)) << " ppl=" << exp(dloss / (dchars_s + dchars_t)) << ' '; // kind of hacky, as trace should be normalised differently
    	cerr << " ppl_s = " << exp(dloss_t2s / dchars_s) << ' ';
    	cerr << " ppl_t = " << exp(dloss_s2t / dchars_t) << ' ';
    	cerr << " trace = " << exp(dloss_trace / dchars_tt) << endl;

        return 0;
    }

    unsigned report_every_i = 50;
    unsigned dev_every_i_reports = 500; // 500
    unsigned si = training.size();
    vector<unsigned> order(training.size());
    for (unsigned i = 0; i < order.size(); ++i) order[i] = i;
    bool first = true;
    int report = 0;
    unsigned lines = 0;
    while(1) {
        Timer iteration("completed in");
        double loss = 0, loss_s2t = 0, loss_t2s = 0, loss_trace = 0;
        unsigned chars_s = 0, chars_t = 0, chars_tt = 0;
        for (unsigned i = 0; i < report_every_i; ++i) {
            if (si == training.size()) {
                si = 0;
                if (first) { first = false; } else { sgd.update_epoch(); }
                cerr << "**SHUFFLE\n";
                shuffle(order.begin(), order.end(), *rndeng);
            }

            // build graph for this instance
            ComputationGraph cg;
            auto& spair = training[order[si]];
            chars_s += spair.first.size() - 1;
            chars_t += spair.second.size() - 1;
            chars_tt += std::max(spair.first.size(), spair.second.size()) - 1; // max or min?
            ++si;
            auto iloss = am.build_graph(spair.first, spair.second, cg);
            loss += as_scalar(cg.forward(iloss));
            loss_s2t += as_scalar(cg.get_value(am.s2t_xent.i));
            loss_t2s += as_scalar(cg.get_value(am.t2s_xent.i));
            loss_trace += as_scalar(cg.get_value(am.trace_bonus.i));
            cg.backward(iloss);
            sgd.update(1.0f);
            ++lines;

            //if ((i+1) == report_every_i) 
            if (si == 1) {
		//Expression aligns = concatenate({transpose(am.src_align), am.tgt_align});
		//cerr << cg.get_value(aligns.i) << "\n";
                am.s2t_model.display_ascii(spair.first, spair.second, cg, am.s2t_align, sd, td);
                am.t2s_model.display_ascii(spair.second, spair.first, cg, am.t2s_align, td, sd);
		cerr << "\txent_s2t " << as_scalar(cg.get_value(am.s2t_xent.i))
		     << "\txent_t2s " << as_scalar(cg.get_value(am.t2s_xent.i))
		     << "\ttrace " << as_scalar(cg.get_value(am.trace_bonus.i)) << endl;
            }
        }
        sgd.status();
        cerr << " E = " << (loss / (chars_s + chars_t)) << " ppl=" << exp(loss / (chars_s + chars_t)) << ' '; // kind of hacky, as trace should be normalised differently
        cerr << " ppl_s = " << exp(loss_t2s / chars_s) << ' ';
        cerr << " ppl_t = " << exp(loss_s2t / chars_t) << ' ';
        cerr << " trace = " << exp(loss_trace / chars_tt) << ' ';

        // show score on dev data?
        report++;
        if (report % dev_every_i_reports == 0) {
            double dloss = 0, dloss_s2t = 0, dloss_t2s = 0, dloss_trace = 0;
            unsigned dchars_s = 0, dchars_t = 0, dchars_tt = 0;
            for (auto& spair : dev) {
                ComputationGraph cg;
                auto idloss = am.build_graph(spair.first, spair.second, cg);
                dloss += as_scalar(cg.incremental_forward(idloss));
                dloss_s2t += as_scalar(cg.get_value(am.s2t_xent.i));
                dloss_t2s += as_scalar(cg.get_value(am.t2s_xent.i));
                dloss_trace += as_scalar(cg.get_value(am.trace_bonus.i));
                dchars_s += spair.first.size() - 1;
                dchars_t += spair.second.size() - 1;
                dchars_tt += std::max(spair.first.size(), spair.second.size()) - 1;
            }
            if (dloss < best) {
                best = dloss;
                ofstream out(fname);
                boost::archive::text_oarchive oa(out);
                oa << model;
            }
            cerr << "\n***DEV [epoch=" << (lines / (double)training.size()) << "]";
            cerr << " E = " << (dloss / (dchars_s + dchars_t)) << " ppl=" << exp(dloss / (dchars_s + dchars_t)) << ' '; // kind of hacky, as trace should be normalised differently
            cerr << " ppl_s = " << exp(dloss_t2s / dchars_s) << ' ';
            cerr << " ppl_t = " << exp(dloss_s2t / dchars_t) << ' ';
            cerr << " trace = " << exp(dloss_trace / dchars_tt) << ' ';
        }
    }

    return 0;
}